

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

u_char * ngx_strnstr(u_char *s1,char *s2,size_t len)

{
  u_char uVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  
  uVar1 = *s2;
  __n = strlen(s2 + 1);
  uVar3 = len - 1;
  do {
    if (uVar3 == 0xffffffffffffffff) {
      return (u_char *)0x0;
    }
    if (*s1 == '\0') {
      return (u_char *)0x0;
    }
    if (*s1 == uVar1) {
      if (uVar3 < __n) {
        return (u_char *)0x0;
      }
      iVar2 = strncmp((char *)(s1 + 1),s2 + 1,__n);
      if (iVar2 == 0) {
        return s1;
      }
    }
    uVar3 = uVar3 - 1;
    s1 = s1 + 1;
  } while( true );
}

Assistant:

u_char *
ngx_strnstr(u_char *s1, char *s2, size_t len)
{
    u_char  c1, c2;
    size_t  n;

    c2 = *(u_char *) s2++;

    n = ngx_strlen(s2);

    do {
        do {
            if (len-- == 0) {
                return NULL;
            }

            c1 = *s1++;

            if (c1 == 0) {
                return NULL;
            }

        } while (c1 != c2);

        if (n > len) {
            return NULL;
        }

    } while (ngx_strncmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}